

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

int doBmpTest(char *ext,int width,int align,int height,int pf,int flags)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  int *height_00;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  uint in_R9D;
  char *pcVar5;
  char *md5ref;
  uchar *buf;
  int pixelFormat;
  int retval;
  int loadHeight;
  int loadWidth;
  int pitch;
  int ps;
  char md5buf [65];
  char *md5sum;
  char filename [80];
  char *pcVar6;
  int local_dc;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  uchar *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  int *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  char local_78 [4];
  int in_stack_ffffffffffffff8c;
  int *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  int local_4;
  
  iVar2 = tjPixelSize[in_R8D];
  local_dc = 0;
  if (in_R8D == 6) {
    iVar1 = strcasecmp(in_RDI,"ppm");
    pcVar3 = "51976530acf75f02beddf5d21149101d";
    if (iVar1 == 0) {
      pcVar3 = "112c682e82ce5de1cca089e20d60000b";
    }
  }
  else {
    iVar1 = strcasecmp(in_RDI,"ppm");
    pcVar3 = "6d659071b9bfcdee2def22cb58ddadca";
    if (iVar1 == 0) {
      pcVar3 = "c0c9f772b464d1896326883a5c79c545";
    }
  }
  puVar4 = tjAlloc(0);
  if (puVar4 == (uchar *)0x0) {
    printf("ERROR: %s\n","Could not allocate memory");
    exitStatus = -1;
  }
  else {
    initBitmap(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    pcVar5 = "td";
    if ((in_R9D & 2) != 0) {
      pcVar5 = "bu";
    }
    pcVar6 = in_RDI;
    snprintf(local_78,0x50,"test_bmp_%s_%d_%s.%s",pixFormatStr[in_R8D],(ulong)in_EDX,pcVar5,in_RDI);
    pcVar5 = (char *)CONCAT44((int)((ulong)pcVar6 >> 0x20),in_R9D);
    iVar1 = tjSaveImage((char *)in_stack_ffffffffffffff68,
                        (uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                        in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff80);
    if (iVar1 == -1) {
      pcVar3 = tjGetErrorStr();
      printf("TurboJPEG ERROR:\n%s\n",pcVar3);
      exitStatus = -1;
    }
    else {
      height_00 = (int *)MD5File(pcVar3,pcVar5);
      iVar1 = strcasecmp((char *)height_00,pcVar3);
      if (iVar1 == 0) {
        tjFree((uchar *)0x1077bb);
        puVar4 = tjLoadImage(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                             in_stack_ffffffffffffff8c,height_00,in_stack_ffffffffffffff78,
                             in_stack_ffffffffffffff74);
        if (puVar4 == (uchar *)0x0) {
          pcVar3 = tjGetErrorStr();
          printf("TurboJPEG ERROR:\n%s\n",pcVar3);
          exitStatus = -1;
        }
        else if ((in_ESI == 0) && (in_ECX == 0)) {
          iVar2 = cmpBitmap(puVar4,0,(in_ESI * iVar2 + in_EDX) - 1 & (in_EDX - 1 ^ 0xffffffff),0,
                            in_R8D,in_R9D,0);
          if (iVar2 == 0) {
            printf("\n   Pixel data in %s is bogus\n",local_78);
            local_dc = -1;
          }
          else {
            if (in_R8D == 6) {
              tjFree((uchar *)0x1078d4);
              puVar4 = tjLoadImage(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c,height_00,in_stack_ffffffffffffff78,
                                   in_stack_ffffffffffffff74);
              if (puVar4 == (uchar *)0x0) {
                pcVar3 = tjGetErrorStr();
                printf("TurboJPEG ERROR:\n%s\n",pcVar3);
                exitStatus = -1;
                goto LAB_00107c01;
              }
              iVar2 = cmpBitmap(puVar4,0,in_EDX - 1 & (in_EDX - 1 ^ 0xffffffff),0,4,in_R9D,1);
              if (iVar2 == 0) {
                printf("\n   Converting %s to RGB failed\n",local_78);
                local_dc = -1;
                goto LAB_00107c01;
              }
              tjFree((uchar *)0x1079e2);
              puVar4 = tjLoadImage(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c,height_00,in_stack_ffffffffffffff78,
                                   in_stack_ffffffffffffff74);
              if (puVar4 == (uchar *)0x0) {
                pcVar3 = tjGetErrorStr();
                printf("TurboJPEG ERROR:\n%s\n",pcVar3);
                exitStatus = -1;
                goto LAB_00107c01;
              }
              iVar2 = cmpBitmap(puVar4,0,in_EDX - 1 & (in_EDX - 1 ^ 0xffffffff),0,0xb,in_R9D,1);
              if (iVar2 == 0) {
                printf("\n   Converting %s to CMYK failed\n",local_78);
                local_dc = -1;
                goto LAB_00107c01;
              }
            }
            tjFree((uchar *)0x107af2);
            puVar4 = tjLoadImage(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c,height_00,in_stack_ffffffffffffff78,
                                 in_stack_ffffffffffffff74);
            if (puVar4 == (uchar *)0x0) {
              pcVar3 = tjGetErrorStr();
              printf("TurboJPEG ERROR:\n%s\n",pcVar3);
              exitStatus = -1;
            }
            else {
              if (((in_R8D == 6) ||
                  ((in_R8D != 6 && (iVar2 = strcasecmp(in_RDI,"bmp"), iVar2 == 0)))) ||
                 ((in_R8D != 6 && (iVar2 = strcasecmp(in_RDI,"ppm"), iVar2 == 0)))) {
                printf("\n   tjLoadImage() returned unexpected pixel format: %s\n",subName[5]);
                local_dc = -1;
              }
              unlink(local_78);
            }
          }
        }
        else {
          printf("\n   Image dimensions of %s are bogus\n",local_78);
          local_dc = -1;
        }
      }
      else {
        printf("\n%s has an MD5 sum of %s.\n   Should be %s.\n",local_78,height_00,pcVar3);
        exitStatus = -1;
      }
    }
  }
LAB_00107c01:
  tjFree((uchar *)0x107c0b);
  if (exitStatus < 0) {
    local_4 = exitStatus;
  }
  else {
    local_4 = local_dc;
  }
  return local_4;
}

Assistant:

static int doBmpTest(const char *ext, int width, int align, int height, int pf,
                     int flags)
{
  char filename[80], *md5sum, md5buf[65];
  int ps = tjPixelSize[pf], pitch = PAD(width * ps, align), loadWidth = 0,
    loadHeight = 0, retval = 0, pixelFormat = pf;
  unsigned char *buf = NULL;
  char *md5ref;

  if (pf == TJPF_GRAY) {
    md5ref = !strcasecmp(ext, "ppm") ? "112c682e82ce5de1cca089e20d60000b" :
                                       "51976530acf75f02beddf5d21149101d";
  } else {
    md5ref = !strcasecmp(ext, "ppm") ? "c0c9f772b464d1896326883a5c79c545" :
                                       "6d659071b9bfcdee2def22cb58ddadca";
  }

  if ((buf = (unsigned char *)tjAlloc(pitch * height)) == NULL)
    THROW("Could not allocate memory");
  initBitmap(buf, width, pitch, height, pf, flags);

  snprintf(filename, 80, "test_bmp_%s_%d_%s.%s", pixFormatStr[pf], align,
           (flags & TJFLAG_BOTTOMUP) ? "bu" : "td", ext);
  TRY_TJ(tjSaveImage(filename, buf, width, pitch, height, pf, flags));
  md5sum = MD5File(filename, md5buf);
  if (strcasecmp(md5sum, md5ref))
    THROW_MD5(filename, md5sum, md5ref);

  tjFree(buf);  buf = NULL;
  if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                         flags)) == NULL)
    THROW_TJ();
  if (width != loadWidth || height != loadHeight) {
    printf("\n   Image dimensions of %s are bogus\n", filename);
    retval = -1;  goto bailout;
  }
  if (!cmpBitmap(buf, width, pitch, height, pf, flags, 0)) {
    printf("\n   Pixel data in %s is bogus\n", filename);
    retval = -1;  goto bailout;
  }
  if (pf == TJPF_GRAY) {
    tjFree(buf);  buf = NULL;
    pf = TJPF_XBGR;
    if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                           flags)) == NULL)
      THROW_TJ();
    pitch = PAD(width * tjPixelSize[pf], align);
    if (!cmpBitmap(buf, width, pitch, height, pf, flags, 1)) {
      printf("\n   Converting %s to RGB failed\n", filename);
      retval = -1;  goto bailout;
    }

    tjFree(buf);  buf = NULL;
    pf = TJPF_CMYK;
    if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                           flags)) == NULL)
      THROW_TJ();
    pitch = PAD(width * tjPixelSize[pf], align);
    if (!cmpBitmap(buf, width, pitch, height, pf, flags, 1)) {
      printf("\n   Converting %s to CMYK failed\n", filename);
      retval = -1;  goto bailout;
    }
  }
  /* Verify that tjLoadImage() returns the proper "preferred" pixel format for
     the file type. */
  tjFree(buf);  buf = NULL;
  pf = pixelFormat;
  pixelFormat = TJPF_UNKNOWN;
  if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight,
                         &pixelFormat, flags)) == NULL)
    THROW_TJ();
  if ((pf == TJPF_GRAY && pixelFormat != TJPF_GRAY) ||
      (pf != TJPF_GRAY && !strcasecmp(ext, "bmp") &&
       pixelFormat != TJPF_BGR) ||
      (pf != TJPF_GRAY && !strcasecmp(ext, "ppm") &&
       pixelFormat != TJPF_RGB)) {
    printf("\n   tjLoadImage() returned unexpected pixel format: %s\n",
           pixFormatStr[pixelFormat]);
    retval = -1;
  }
  unlink(filename);

bailout:
  tjFree(buf);
  if (exitStatus < 0) return exitStatus;
  return retval;
}